

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypeArgFormatter::TypeArgFormatter(TypeArgFormatter *this)

{
  (this->super_DiagArgFormatter)._vptr_DiagArgFormatter =
       (_func_int **)&PTR__TypeArgFormatter_005b3f90;
  TypePrinter::TypePrinter(&this->printer);
  boost::unordered::
  unordered_flat_set<const_slang::ast::Type_*,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::unordered_flat_set(&this->seenTypes);
  boost::unordered::
  unordered_flat_set<const_slang::ast::Type_*,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::unordered_flat_set(&this->typesToDisambiguate);
  (this->printer).options.addSingleQuotes = true;
  (this->printer).options.elideScopeNames = true;
  (this->printer).options.printAKA = true;
  (this->printer).options.anonymousTypeStyle = FriendlyName;
  return;
}

Assistant:

TypeArgFormatter::TypeArgFormatter() {
    printer.options.addSingleQuotes = true;
    printer.options.elideScopeNames = true;
    printer.options.printAKA = true;
    printer.options.anonymousTypeStyle = TypePrintingOptions::FriendlyName;
}